

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum-dtoa.cc
# Opt level: O1

void __thiscall
FIX::double_conversion::BignumDtoa
          (double_conversion *this,double v,BignumDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  char cVar1;
  Vector<char> buffer_00;
  byte bVar2;
  uint16_t uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined4 in_register_00000014;
  Bignum *denominator_00;
  ulong uVar13;
  ulong uVar14;
  Bignum *pBVar15;
  uint *puVar16;
  uint uVar17;
  ulong factor;
  bool bVar18;
  bool bVar19;
  double dVar20;
  float fVar21;
  Bignum denominator;
  Bignum numerator;
  Bignum delta_minus;
  Bignum delta_plus;
  undefined8 in_stack_fffffffffffff740;
  Bignum local_890;
  Bignum local_678;
  Bignum local_460;
  Bignum local_248;
  
  denominator_00 = (Bignum *)CONCAT44(in_register_00000014,requested_digits);
  puVar16 = buffer._8_8_;
  uVar10 = (uint)buffer.start_;
  if (v <= 0.0) {
    __assert_fail("v > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                  ,0x5b,
                  "void FIX::double_conversion::BignumDtoa(double, BignumDtoaMode, int, Vector<char>, int *, int *)"
                 );
  }
  uVar13 = (ulong)v & 0x7ff0000000000000;
  if (uVar13 == 0x7ff0000000000000) {
    __assert_fail("!Double(v).IsSpecial()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                  ,0x5c,
                  "void FIX::double_conversion::BignumDtoa(double, BignumDtoaMode, int, Vector<char>, int *, int *)"
                 );
  }
  uVar17 = (uint)this;
  if (uVar17 == 1) {
    fVar21 = (float)v;
    if (((double)fVar21 != v) || (NAN((double)fVar21) || NAN(v))) {
      __assert_fail("f == v",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                    ,0x62,
                    "void FIX::double_conversion::BignumDtoa(double, BignumDtoaMode, int, Vector<char>, int *, int *)"
                   );
    }
    uVar12 = (uint)fVar21 & 0x7fffff;
    uVar11 = uVar12 | 0x800000;
    if ((uint)fVar21 < 0x800000) {
      uVar11 = uVar12;
    }
    factor = (ulong)uVar11;
    iVar8 = -0x95;
    if ((uint)fVar21 >= 0x800000) {
      iVar8 = ((uint)fVar21 >> 0x17) - 0x96;
    }
    bVar19 = uVar12 == 0;
    bVar18 = 0xffffff < (uint)fVar21;
  }
  else {
    uVar14 = (ulong)v & 0xfffffffffffff;
    factor = uVar14 + 0x10000000000000;
    if (uVar13 == 0) {
      factor = uVar14;
    }
    iVar8 = -0x432;
    if (uVar13 != 0) {
      iVar8 = (uint)((ulong)v >> 0x34) - 0x433;
    }
    bVar19 = uVar14 == 0;
    bVar18 = (ulong)v >> 0x35 != 0;
  }
  if (factor == 0) {
    __assert_fail("significand != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                  ,0x26,"int FIX::double_conversion::NormalizedExponent(uint64_t, int)");
  }
  lVar9 = 0x3f;
  if ((factor & 0xfffffffffffff) != 0) {
    for (; (factor & 0xfffffffffffff) >> lVar9 == 0; lVar9 = lVar9 + -1) {
    }
  }
  iVar4 = (iVar8 + 0xb) - ((uint)lVar9 ^ 0x3f);
  if ((factor & 0x10000000000000) != 0) {
    iVar4 = iVar8;
  }
  dVar20 = ceil((double)(iVar4 + 0x34) * 0.30102999566398114 + -1e-10);
  uVar11 = (uint)dVar20;
  if ((uVar17 == 2) && ((int)mode < (int)~uVar11)) {
    if (0 < (int)uVar10) {
      *(undefined1 *)denominator_00->bigits_buffer_ = 0;
      *puVar16 = 0;
      *length = -mode;
      return;
    }
    goto LAB_0016b4db;
  }
  Bignum::Bignum(&local_678);
  Bignum::Bignum(&local_890);
  Bignum::Bignum(&local_460);
  Bignum::Bignum(&local_248);
  if (iVar8 < 0) {
    if ((int)uVar11 < 0) {
      Bignum::AssignPowerUInt16(&local_678,10,-uVar11);
      if (uVar17 < 2) {
        Bignum::AssignBignum(&local_248,&local_678);
        Bignum::AssignBignum(&local_460,&local_678);
        Bignum::MultiplyByUInt64(&local_678,factor);
        pBVar15 = &local_890;
        Bignum::AssignUInt16(pBVar15,1);
        Bignum::ShiftLeft(pBVar15,-iVar8);
        Bignum::ShiftLeft(&local_678,1);
        iVar8 = 1;
      }
      else {
        Bignum::MultiplyByUInt64(&local_678,factor);
        pBVar15 = &local_890;
        Bignum::AssignUInt16(pBVar15,1);
        iVar8 = -iVar8;
      }
      goto LAB_0016afa8;
    }
    Bignum::AssignUInt64(&local_678,factor);
    Bignum::AssignPowerUInt16(&local_890,10,uVar11);
    Bignum::ShiftLeft(&local_890,-iVar8);
    if (uVar17 < 2) {
      Bignum::ShiftLeft(&local_890,1);
      Bignum::ShiftLeft(&local_678,1);
      Bignum::AssignUInt16(&local_248,1);
      Bignum::AssignUInt16(&local_460,1);
    }
  }
  else {
    if ((int)uVar11 < 0) {
      __assert_fail("estimated_power >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                    ,0x1a7,
                    "void FIX::double_conversion::InitialScaledStartValuesPositiveExponent(uint64_t, int, int, bool, Bignum *, Bignum *, Bignum *, Bignum *)"
                   );
    }
    Bignum::AssignUInt64(&local_678,factor);
    Bignum::ShiftLeft(&local_678,iVar8);
    Bignum::AssignPowerUInt16(&local_890,10,uVar11);
    if (uVar17 < 2) {
      Bignum::ShiftLeft(&local_890,1);
      Bignum::ShiftLeft(&local_678,1);
      Bignum::AssignUInt16(&local_248,1);
      Bignum::ShiftLeft(&local_248,iVar8);
      pBVar15 = &local_460;
      Bignum::AssignUInt16(pBVar15,1);
LAB_0016afa8:
      Bignum::ShiftLeft(pBVar15,iVar8);
    }
  }
  if (!(bool)(bVar18 & bVar19 ^ 1U | 1 < uVar17)) {
    Bignum::ShiftLeft(&local_890,1);
    Bignum::ShiftLeft(&local_678,1);
    Bignum::ShiftLeft(&local_248,1);
  }
  iVar4 = Bignum::PlusCompare(&local_678,&local_248,&local_890);
  uVar12 = (uint)((factor & 1) == 0);
  iVar8 = -uVar12;
  if (iVar4 == iVar8 || SBORROW4(iVar4,iVar8) != (int)(iVar4 + uVar12) < 0) {
    *length = uVar11;
    Bignum::MultiplyByUInt32(&local_678,10);
    iVar8 = Bignum::Compare(&local_460,&local_248);
    Bignum::MultiplyByUInt32(&local_460,10);
    if (iVar8 == 0) {
      Bignum::AssignBignum(&local_248,&local_460);
    }
    else {
      Bignum::MultiplyByUInt32(&local_248,10);
    }
  }
  else {
    *length = uVar11 + 1;
  }
  if (uVar17 < 2) {
    iVar8 = Bignum::Compare(&local_460,&local_248);
    pBVar15 = &local_248;
    if (iVar8 == 0) {
      pBVar15 = &local_460;
    }
    *puVar16 = 0;
    uVar17 = (uint)factor & 1 ^ 1;
    iVar4 = -(uint)((factor & 1) == 0);
    do {
      uVar3 = Bignum::DivideModuloIntBignum(&local_678,&local_890);
      if (9 < uVar3) {
        __assert_fail("digit <= 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                      ,0xc6,
                      "void FIX::double_conversion::GenerateShortestDigits(Bignum *, Bignum *, Bignum *, Bignum *, bool, Vector<char>, int *)"
                     );
      }
      uVar11 = *puVar16;
      *puVar16 = uVar11 + 1;
      if (((long)(int)uVar11 < 0) || ((int)uVar10 <= (int)uVar11)) goto LAB_0016b4db;
      *(byte *)((long)denominator_00->bigits_buffer_ + (long)(int)uVar11) = (byte)uVar3 | 0x30;
      iVar5 = Bignum::Compare(&local_678,&local_460);
      iVar6 = Bignum::PlusCompare(&local_678,pBVar15,&local_890);
      if (iVar6 <= iVar4 && (int)uVar17 <= iVar5) {
        Bignum::MultiplyByUInt32(&local_678,10);
        Bignum::MultiplyByUInt32(&local_460,10);
        if (iVar8 != 0) {
          Bignum::MultiplyByUInt32(pBVar15,10);
        }
      }
      else if ((iVar5 < (int)uVar17) && (iVar4 < iVar6)) {
        iVar7 = Bignum::PlusCompare(&local_678,&local_678,&local_890);
        if (-1 < iVar7) {
          uVar11 = *puVar16;
          uVar13 = (ulong)uVar11;
          if (iVar7 == 0) {
            if ((int)uVar10 < (int)uVar11 || (int)uVar11 < 1) goto LAB_0016b4db;
            bVar2 = *(byte *)((long)denominator_00->bigits_buffer_ + (uVar13 - 1));
            if ((bVar2 & 1) == 0) goto LAB_0016b336;
            if (bVar2 == 0x39) {
              __assert_fail("buffer[(*length) - 1] != \'9\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                            ,0xff,
                            "void FIX::double_conversion::GenerateShortestDigits(Bignum *, Bignum *, Bignum *, Bignum *, bool, Vector<char>, int *)"
                           );
            }
          }
          else {
            if ((int)uVar10 < (int)uVar11 || (int)uVar11 < 1) goto LAB_0016b4db;
            bVar2 = *(byte *)((long)denominator_00->bigits_buffer_ + (uVar13 - 1));
            if (bVar2 == 0x39) {
              __assert_fail("buffer[(*length) - 1] != \'9\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                            ,0xf4,
                            "void FIX::double_conversion::GenerateShortestDigits(Bignum *, Bignum *, Bignum *, Bignum *, bool, Vector<char>, int *)"
                           );
            }
          }
          *(byte *)((long)denominator_00->bigits_buffer_ + (uVar13 - 1)) = bVar2 + 1;
        }
      }
      else if ((int)uVar17 <= iVar5) {
        lVar9 = (long)(int)*puVar16;
        if ((lVar9 < 1) || ((int)uVar10 < (int)*puVar16)) goto LAB_0016b4db;
        cVar1 = *(char *)((long)denominator_00->bigits_buffer_ + lVar9 + -1);
        if (cVar1 == '9') {
          __assert_fail("buffer[(*length) -1] != \'9\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                        ,0x10d,
                        "void FIX::double_conversion::GenerateShortestDigits(Bignum *, Bignum *, Bignum *, Bignum *, bool, Vector<char>, int *)"
                       );
        }
        *(char *)((long)denominator_00->bigits_buffer_ + lVar9 + -1) = cVar1 + '\x01';
      }
LAB_0016b336:
    } while (iVar6 <= iVar4 && (int)uVar17 <= iVar5);
  }
  else if (uVar17 == 2) {
    iVar8 = *length;
    if ((int)mode < -iVar8) {
      *length = -mode;
      *puVar16 = 0;
    }
    else {
      if (-iVar8 != mode) {
        mode = iVar8 + mode;
        goto LAB_0016b160;
      }
      if (iVar8 + mode != 0) {
        __assert_fail("*decimal_point == -requested_digits",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                      ,0x158,
                      "void FIX::double_conversion::BignumToFixed(int, int *, Bignum *, Bignum *, Vector<char>, int *)"
                     );
      }
      Bignum::MultiplyByUInt32(&local_890,10);
      iVar8 = Bignum::PlusCompare(&local_678,&local_678,&local_890);
      if (iVar8 < 0) {
        *puVar16 = 0;
      }
      else {
        if ((int)uVar10 < 1) goto LAB_0016b4db;
        *(undefined1 *)denominator_00->bigits_buffer_ = 0x31;
        *puVar16 = 1;
        *length = *length + 1;
      }
    }
  }
  else {
    if (uVar17 != 3) {
      abort();
    }
LAB_0016b160:
    buffer_00._8_8_ = in_stack_fffffffffffff740;
    buffer_00.start_ = (char *)puVar16;
    GenerateCountedDigits
              ((double_conversion *)(ulong)mode,(int)length,(int *)&local_678,&local_890,
               denominator_00,buffer_00,(int *)(ulong)uVar10);
  }
  uVar17 = *puVar16;
  if ((-1 < (long)(int)uVar17) && ((int)uVar17 < (int)uVar10)) {
    *(undefined1 *)((long)denominator_00->bigits_buffer_ + (long)(int)uVar17) = 0;
    return;
  }
LAB_0016b4db:
  __assert_fail("0 <= index && index < length_",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                ,0xcc,"T &FIX::double_conversion::Vector<char>::operator[](int) const [T = char]");
}

Assistant:

void BignumDtoa(double v, BignumDtoaMode mode, int requested_digits,
                Vector<char> buffer, int* length, int* decimal_point) {
  ASSERT(v > 0);
  ASSERT(!Double(v).IsSpecial());
  uint64_t significand;
  int exponent;
  bool lower_boundary_is_closer;
  if (mode == BIGNUM_DTOA_SHORTEST_SINGLE) {
    float f = static_cast<float>(v);
    ASSERT(f == v);
    significand = Single(f).Significand();
    exponent = Single(f).Exponent();
    lower_boundary_is_closer = Single(f).LowerBoundaryIsCloser();
  } else {
    significand = Double(v).Significand();
    exponent = Double(v).Exponent();
    lower_boundary_is_closer = Double(v).LowerBoundaryIsCloser();
  }
  bool need_boundary_deltas =
      (mode == BIGNUM_DTOA_SHORTEST || mode == BIGNUM_DTOA_SHORTEST_SINGLE);

  bool is_even = (significand & 1) == 0;
  int normalized_exponent = NormalizedExponent(significand, exponent);
  // estimated_power might be too low by 1.
  int estimated_power = EstimatePower(normalized_exponent);

  // Shortcut for Fixed.
  // The requested digits correspond to the digits after the point. If the
  // number is much too small, then there is no need in trying to get any
  // digits.
  if (mode == BIGNUM_DTOA_FIXED && -estimated_power - 1 > requested_digits) {
    buffer[0] = '\0';
    *length = 0;
    // Set decimal-point to -requested_digits. This is what Gay does.
    // Note that it should not have any effect anyways since the string is
    // empty.
    *decimal_point = -requested_digits;
    return;
  }

  Bignum numerator;
  Bignum denominator;
  Bignum delta_minus;
  Bignum delta_plus;
  // Make sure the bignum can grow large enough. The smallest double equals
  // 4e-324. In this case the denominator needs fewer than 324*4 binary digits.
  // The maximum double is 1.7976931348623157e308 which needs fewer than
  // 308*4 binary digits.
  ASSERT(Bignum::kMaxSignificantBits >= 324*4);
  InitialScaledStartValues(significand, exponent, lower_boundary_is_closer,
                           estimated_power, need_boundary_deltas,
                           &numerator, &denominator,
                           &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^estimated_power.
  FixupMultiply10(estimated_power, is_even, decimal_point,
                  &numerator, &denominator,
                  &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^(decimal_point-1), and
  //  1 <= (numerator + delta_plus) / denominator < 10
  switch (mode) {
    case BIGNUM_DTOA_SHORTEST:
    case BIGNUM_DTOA_SHORTEST_SINGLE:
      GenerateShortestDigits(&numerator, &denominator,
                             &delta_minus, &delta_plus,
                             is_even, buffer, length);
      break;
    case BIGNUM_DTOA_FIXED:
      BignumToFixed(requested_digits, decimal_point,
                    &numerator, &denominator,
                    buffer, length);
      break;
    case BIGNUM_DTOA_PRECISION:
      GenerateCountedDigits(requested_digits, decimal_point,
                            &numerator, &denominator,
                            buffer, length);
      break;
    default:
      UNREACHABLE();
  }
  buffer[*length] = '\0';
}